

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array3.h
# Opt level: O0

void __thiscall
Array3<float,_Array1<float>_>::resize(Array3<float,_Array1<float>_> *this,int ni_,int nj_,int nk_)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array1<float> *in_RDI;
  bool bVar1;
  unsigned_long in_stack_ffffffffffffffd8;
  
  bVar1 = false;
  if ((-1 < in_ESI) && (bVar1 = false, -1 < in_EDX)) {
    bVar1 = -1 < in_ECX;
  }
  if (!bVar1) {
    __assert_fail("ni_>=0 && nj_>=0 && nk_>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alecjacobson[P]SDFGen/array3.h"
                  ,0xe1,
                  "void Array3<float, Array1<float>>::resize(int, int, int) [T = float, ArrayT = Array1<float>]"
                 );
  }
  Array1<float>::resize(in_RDI,in_stack_ffffffffffffffd8);
  *(int *)&in_RDI->n = in_ESI;
  *(int *)((long)&in_RDI->n + 4) = in_EDX;
  *(int *)&in_RDI->max_n = in_ECX;
  return;
}

Assistant:

void resize(int ni_, int nj_, int nk_)
   {
      assert(ni_>=0 && nj_>=0 && nk_>=0);
      a.resize(ni_*nj_*nk_);
      ni=ni_;
      nj=nj_;
      nk=nk_;
   }